

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureFilteringAnisotropyTests.cpp
# Opt level: O1

TestCaseGroup * vkt::texture::createFilteringAnisotropyTests(TestContext *testCtx)

{
  size_type *psVar1;
  FilterMode FVar2;
  TestNode *pTVar3;
  FilteringAnisotropyTests *pFVar4;
  long *plVar5;
  undefined8 *puVar6;
  long *plVar7;
  ulong *puVar8;
  TestNode *pTVar9;
  long lVar10;
  ulong uVar11;
  undefined8 *puVar12;
  long lVar13;
  long lVar14;
  AnisotropyParams refParams;
  allocator<char> local_1da;
  allocator<char> local_1d9;
  TestNode *local_1d8;
  TestNode *local_1d0;
  string local_1c8;
  float local_1a8;
  FilterMode local_1a4;
  TestContext *local_1a0;
  long *local_198;
  long local_190;
  long local_188;
  long lStack_180;
  ulong *local_178;
  long local_170;
  ulong local_168 [2];
  ulong *local_158;
  long local_150;
  ulong local_148;
  long lStack_140;
  TestNode *local_138;
  TestNode *local_130;
  string local_128;
  long local_108;
  long local_100;
  long *local_f8 [2];
  long local_e8 [2];
  AnisotropyParams local_d4;
  
  local_130 = (TestNode *)operator_new(0x70);
  local_1a0 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_130,testCtx,"filtering_anisotropy","Filtering anisotropy tests")
  ;
  local_1d0 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_1d0,local_1a0,"basic","Filtering anisotropy tests");
  local_138 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_138,local_1a0,"mipmap","Filtering anisotropy tests");
  lVar13 = 0;
  do {
    local_1d8 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)local_1d8,local_1a0,(&PTR_anon_var_dwarf_1b27f5b_00d68180)[lVar13],
               "Filtering anisotropy tests");
    local_1a8 = (float)(&DAT_00b84b90)[lVar13];
    lVar14 = 0;
    local_108 = lVar13;
    do {
      local_1a4 = tessellation::createCommonEdgeTests(tcu::TestContext&)::primitiveTypes[lVar14];
      puVar12 = &DAT_00d681a0;
      lVar10 = 0;
      lVar13 = lVar14;
      local_100 = lVar14;
      do {
        FVar2 = *(FilterMode *)
                 ((long)tessellation::createCommonEdgeTests(tcu::TestContext&)::primitiveTypes +
                 lVar10);
        glu::TextureTestUtil::ReferenceParams::ReferenceParams
                  (&local_d4.super_ReferenceParams,TEXTURETYPE_2D);
        local_d4.maxAnisotropy = local_1a8;
        local_d4.minFilter = local_1a4;
        local_d4.mipMap = false;
        local_d4.magFilter = FVar2;
        pFVar4 = (FilteringAnisotropyTests *)operator_new(0x118);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_f8,(char *)*puVar12,&local_1d9);
        plVar5 = (long *)std::__cxx11::string::replace((ulong)local_f8,0,(char *)0x0,0xb54b11);
        local_198 = &local_188;
        plVar7 = plVar5 + 2;
        if ((long *)*plVar5 == plVar7) {
          local_188 = *plVar7;
          lStack_180 = plVar5[3];
        }
        else {
          local_188 = *plVar7;
          local_198 = (long *)*plVar5;
        }
        local_190 = plVar5[1];
        *plVar5 = (long)plVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_198);
        puVar8 = (ulong *)(plVar5 + 2);
        if ((ulong *)*plVar5 == puVar8) {
          local_148 = *puVar8;
          lStack_140 = plVar5[3];
          local_158 = &local_148;
        }
        else {
          local_148 = *puVar8;
          local_158 = (ulong *)*plVar5;
        }
        local_150 = plVar5[1];
        *plVar5 = (long)puVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_178,(char *)(&DAT_00d681a0)[lVar13],&local_1da);
        uVar11 = 0xf;
        if (local_158 != &local_148) {
          uVar11 = local_148;
        }
        if (uVar11 < (ulong)(local_170 + local_150)) {
          uVar11 = 0xf;
          if (local_178 != local_168) {
            uVar11 = local_168[0];
          }
          if (uVar11 < (ulong)(local_170 + local_150)) goto LAB_0083f549;
          puVar6 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_178,0,(char *)0x0,(ulong)local_158);
        }
        else {
LAB_0083f549:
          puVar6 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_178);
        }
        local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
        psVar1 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar1) {
          local_1c8.field_2._M_allocated_capacity = *psVar1;
          local_1c8.field_2._8_4_ = *(undefined4 *)(puVar6 + 3);
          local_1c8.field_2._12_4_ = *(undefined4 *)((long)puVar6 + 0x1c);
        }
        else {
          local_1c8.field_2._M_allocated_capacity = *psVar1;
          local_1c8._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_1c8._M_string_length = puVar6[1];
        *puVar6 = psVar1;
        puVar6[1] = 0;
        *(undefined1 *)psVar1 = 0;
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_128,"Texture filtering anisotropy basic tests","");
        anon_unknown_0::FilteringAnisotropyTests::FilteringAnisotropyTests
                  (pFVar4,local_1a0,&local_1c8,&local_128,&local_d4);
        tcu::TestNode::addChild(local_1d8,(TestNode *)pFVar4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        lVar13 = local_100;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        if (local_178 != local_168) {
          operator_delete(local_178,local_168[0] + 1);
        }
        if (local_158 != &local_148) {
          operator_delete(local_158,local_148 + 1);
        }
        if (local_198 != &local_188) {
          operator_delete(local_198,local_188 + 1);
        }
        if (local_f8[0] != local_e8) {
          operator_delete(local_f8[0],local_e8[0] + 1);
        }
        lVar10 = lVar10 + 4;
        puVar12 = puVar12 + 1;
      } while (lVar10 == 4);
      lVar14 = lVar13 + 1;
    } while (lVar13 == 0);
    tcu::TestNode::addChild(local_1d0,local_1d8);
    lVar13 = local_108 + 1;
  } while (lVar13 != 4);
  tcu::TestNode::addChild(local_130,local_1d0);
  pTVar9 = (TestNode *)0x0;
  do {
    local_1d8 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)local_1d8,local_1a0,
               (&PTR_anon_var_dwarf_1b27f5b_00d68180)[(long)pTVar9],"Filtering anisotropy tests");
    local_1a8 = (float)(&DAT_00b84b90)[(long)pTVar9];
    lVar13 = 0;
    local_1d0 = pTVar9;
    do {
      local_1a4 = (&DAT_00b84ba0)[lVar13];
      local_100 = lVar13 * 4;
      puVar12 = &DAT_00d681a0;
      lVar14 = 0;
      local_108 = lVar13;
      do {
        FVar2 = *(FilterMode *)
                 ((long)tessellation::createCommonEdgeTests(tcu::TestContext&)::primitiveTypes +
                 lVar14);
        glu::TextureTestUtil::ReferenceParams::ReferenceParams
                  (&local_d4.super_ReferenceParams,TEXTURETYPE_2D);
        local_d4.maxAnisotropy = local_1a8;
        local_d4.minFilter = local_1a4;
        local_d4.mipMap = true;
        local_d4.magFilter = FVar2;
        pFVar4 = (FilteringAnisotropyTests *)operator_new(0x118);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_f8,(char *)*puVar12,&local_1d9);
        plVar5 = (long *)std::__cxx11::string::replace((ulong)local_f8,0,(char *)0x0,0xb54b11);
        local_198 = &local_188;
        plVar7 = plVar5 + 2;
        if ((long *)*plVar5 == plVar7) {
          local_188 = *plVar7;
          lStack_180 = plVar5[3];
        }
        else {
          local_188 = *plVar7;
          local_198 = (long *)*plVar5;
        }
        local_190 = plVar5[1];
        *plVar5 = (long)plVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_198);
        puVar8 = (ulong *)(plVar5 + 2);
        if ((ulong *)*plVar5 == puVar8) {
          local_148 = *puVar8;
          lStack_140 = plVar5[3];
          local_158 = &local_148;
        }
        else {
          local_148 = *puVar8;
          local_158 = (ulong *)*plVar5;
        }
        local_150 = plVar5[1];
        *plVar5 = (long)puVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_178,&DAT_00b84d80 + *(int *)(&DAT_00b84d80 + local_100),
                   &local_1da);
        uVar11 = 0xf;
        if (local_158 != &local_148) {
          uVar11 = local_148;
        }
        if (uVar11 < (ulong)(local_170 + local_150)) {
          uVar11 = 0xf;
          if (local_178 != local_168) {
            uVar11 = local_168[0];
          }
          if (uVar11 < (ulong)(local_170 + local_150)) goto LAB_0083f94c;
          puVar6 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_178,0,(char *)0x0,(ulong)local_158);
        }
        else {
LAB_0083f94c:
          puVar6 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_178);
        }
        local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
        psVar1 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar1) {
          local_1c8.field_2._M_allocated_capacity = *psVar1;
          local_1c8.field_2._8_4_ = *(undefined4 *)(puVar6 + 3);
          local_1c8.field_2._12_4_ = *(undefined4 *)((long)puVar6 + 0x1c);
        }
        else {
          local_1c8.field_2._M_allocated_capacity = *psVar1;
          local_1c8._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_1c8._M_string_length = puVar6[1];
        *puVar6 = psVar1;
        puVar6[1] = 0;
        *(undefined1 *)psVar1 = 0;
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_128,"Texture filtering anisotropy basic tests","");
        anon_unknown_0::FilteringAnisotropyTests::FilteringAnisotropyTests
                  (pFVar4,local_1a0,&local_1c8,&local_128,&local_d4);
        tcu::TestNode::addChild(local_1d8,(TestNode *)pFVar4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        if (local_178 != local_168) {
          operator_delete(local_178,local_168[0] + 1);
        }
        if (local_158 != &local_148) {
          operator_delete(local_158,local_148 + 1);
        }
        if (local_198 != &local_188) {
          operator_delete(local_198,local_188 + 1);
        }
        if (local_f8[0] != local_e8) {
          operator_delete(local_f8[0],local_e8[0] + 1);
        }
        lVar14 = lVar14 + 4;
        puVar12 = puVar12 + 1;
      } while (lVar14 == 4);
      lVar13 = local_108 + 1;
    } while (lVar13 != 4);
    tcu::TestNode::addChild(local_138,local_1d8);
    pTVar3 = local_130;
    pTVar9 = (TestNode *)((long)&local_1d0->_vptr_TestNode + 1);
    if (pTVar9 == (TestNode *)0x4) {
      tcu::TestNode::addChild(local_130,local_138);
      return (TestCaseGroup *)pTVar3;
    }
  } while( true );
}

Assistant:

tcu::TestCaseGroup* createFilteringAnisotropyTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup>	filteringAnisotropyTests	(new tcu::TestCaseGroup(testCtx,	"filtering_anisotropy",	"Filtering anisotropy tests"));
	de::MovePtr<tcu::TestCaseGroup>	basicTests					(new tcu::TestCaseGroup(testCtx, "basic", "Filtering anisotropy tests"));
	de::MovePtr<tcu::TestCaseGroup>	mipmapTests					(new tcu::TestCaseGroup(testCtx, "mipmap", "Filtering anisotropy tests"));
	const char*						valueName[]					=
	{
		"anisotropy_2",
		"anisotropy_4",
		"anisotropy_8",
		"anisotropy_max"
	};
	const float						maxAnisotropy[]				=
	{
		2.0f,
		4.0f,
		8.0f,
		10000.0f	//too huge will be flated to max value
	};
	const char*						magFilterName[]				=
	{
		"nearest",
		"linear"
	};
	const tcu::Sampler::FilterMode	magFilters[]				=
	{
		Sampler::NEAREST,
		Sampler::LINEAR
	};

	{
		const tcu::Sampler::FilterMode*	minFilters		= magFilters;
		const char**					minFilterName	= magFilterName;

		for (int anisotropyNdx = 0; anisotropyNdx < DE_LENGTH_OF_ARRAY(maxAnisotropy); anisotropyNdx++)
		{
			de::MovePtr<tcu::TestCaseGroup> levelAnisotropyGroups (new tcu::TestCaseGroup(testCtx, valueName[anisotropyNdx], "Filtering anisotropy tests"));

			for (int minFilterNdx = 0; minFilterNdx < DE_LENGTH_OF_ARRAY(magFilters); minFilterNdx++)
			for (int magFilterNdx = 0; magFilterNdx < DE_LENGTH_OF_ARRAY(magFilters); magFilterNdx++)
			{
				AnisotropyParams	refParams	(TEXTURETYPE_2D, maxAnisotropy[anisotropyNdx] ,minFilters[minFilterNdx], magFilters[magFilterNdx]);
				levelAnisotropyGroups->addChild(new FilteringAnisotropyTests(testCtx,
														"mag_" + string(magFilterName[magFilterNdx]) + "_min_" + string(minFilterName[minFilterNdx]),
														"Texture filtering anisotropy basic tests", refParams));
			}
			basicTests->addChild(levelAnisotropyGroups.release());
		}
		filteringAnisotropyTests->addChild(basicTests.release());
	}

	{
		const tcu::Sampler::FilterMode		minFilters[]	=
		{
			Sampler::NEAREST_MIPMAP_NEAREST,
			Sampler::NEAREST_MIPMAP_LINEAR,
			Sampler::LINEAR_MIPMAP_NEAREST,
			Sampler::LINEAR_MIPMAP_LINEAR
		};
		const char*							minFilterName[]	=
		{
			"nearest_mipmap_nearest",
			"nearest_mipmap_linear",
			"linear_mipmap_nearest",
			"linear_mipmap_linear"
		};

		for (int anisotropyNdx = 0; anisotropyNdx < DE_LENGTH_OF_ARRAY(maxAnisotropy); anisotropyNdx++)
		{
			de::MovePtr<tcu::TestCaseGroup> levelAnisotropyGroups (new tcu::TestCaseGroup(testCtx, valueName[anisotropyNdx], "Filtering anisotropy tests"));

			for (int minFilterNdx = 0; minFilterNdx < DE_LENGTH_OF_ARRAY(minFilters); minFilterNdx++)
			for (int magFilterNdx = 0; magFilterNdx < DE_LENGTH_OF_ARRAY(magFilters); magFilterNdx++)
			{
				AnisotropyParams	refParams	(TEXTURETYPE_2D, maxAnisotropy[anisotropyNdx] ,minFilters[minFilterNdx], magFilters[magFilterNdx], true);
				levelAnisotropyGroups->addChild(new FilteringAnisotropyTests(testCtx,
														"mag_" + string(magFilterName[magFilterNdx]) + "_min_" + string(minFilterName[minFilterNdx]),
														"Texture filtering anisotropy basic tests", refParams));
			}
			mipmapTests->addChild(levelAnisotropyGroups.release());
		}
		filteringAnisotropyTests->addChild(mipmapTests.release());
	}

	return filteringAnisotropyTests.release();
}